

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feature_resolver.cc
# Opt level: O1

Status __thiscall
google::protobuf::(anonymous_namespace)::Error<char_const*,google::protobuf::Edition,char_const*>
          (_anonymous_namespace_ *this,char *args,Edition args_1,char *args_2)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  AlphaNum *in_R8;
  string_view message;
  StringifySink local_f8;
  string local_d0;
  AlphaNum local_b0;
  size_t local_80;
  char *local_78;
  AlphaNum local_50;
  
  if (args == (char *)0x0) {
    local_80 = 0;
    args = (char *)0x0;
  }
  else {
    local_80 = strlen(args);
  }
  paVar1 = &local_f8.buffer_.field_2;
  local_f8.buffer_.field_2._8_8_ = 0;
  local_f8.buffer_._M_string_length = 0;
  local_f8.buffer_.field_2._M_allocated_capacity = 0;
  local_f8.buffer_._M_dataplus._M_p = (pointer)paVar1;
  local_78 = args;
  AbslStringify<absl::lts_20250127::strings_internal::StringifySink>(&local_f8,args_1);
  local_b0.piece_._M_len = local_f8.buffer_._M_string_length;
  local_b0.piece_._M_str = local_f8.buffer_._M_dataplus._M_p;
  if (args_2 == (char *)0x0) {
    local_50.piece_._M_len = 0;
    args_2 = (char *)0x0;
  }
  else {
    local_50.piece_._M_len = strlen(args_2);
  }
  local_50.piece_._M_str = args_2;
  absl::lts_20250127::StrCat_abi_cxx11_
            (&local_d0,(lts_20250127 *)&local_80,&local_b0,&local_50,in_R8);
  message._M_str = (char *)local_d0._M_string_length;
  message._M_len = (size_t)this;
  absl::lts_20250127::FailedPreconditionError(message);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8.buffer_._M_dataplus._M_p != paVar1) {
    operator_delete(local_f8.buffer_._M_dataplus._M_p,
                    local_f8.buffer_.field_2._M_allocated_capacity + 1);
  }
  return (Status)(uintptr_t)this;
}

Assistant:

absl::Status Error(Args... args) {
  return absl::FailedPreconditionError(absl::StrCat(args...));
}